

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O1

int __thiscall jrtplib::RTPUDPv4Transmitter::PollSocket(RTPUDPv4Transmitter *this,bool rtp)

{
  size_t *psVar1;
  RTPMemoryManager *pRVar2;
  bool bVar3;
  int iVar4;
  ssize_t sVar5;
  _List_node_base *p_Var6;
  _List_node_base *__dest;
  _List_node_base *p_Var7;
  ushort uVar8;
  uint uVar9;
  int unaff_EBP;
  uint uVar10;
  undefined7 in_register_00000031;
  RTCPCommonHeader *rtcpheader;
  bool bVar11;
  int sock;
  size_t len;
  int8_t isset;
  uint fromlen;
  sockaddr_in srcaddr;
  timespec tpMono_1;
  char packetbuffer [65535];
  int iStack_100a4;
  long lStack_100a0;
  timespec tStack_10098;
  int iStack_10084;
  uint uStack_10080;
  socklen_t sStack_1007c;
  _List_node_base *p_Stack_10078;
  sockaddr sStack_10070;
  list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_> *plStack_10060;
  RTPUDPv4Transmitter *pRStack_10058;
  _List_node_base *p_Stack_10050;
  timespec tStack_10048;
  undefined1 auStack_10038 [65544];
  _List_node_base *__n;
  
  uStack_10080 = (uint)CONCAT71(in_register_00000031,rtp);
  iStack_100a4 = *(int *)((long)(this->destinations).table + (ulong)!rtp * 4 + -0x54);
  iStack_10084 = 2 - uStack_10080;
  plStack_10060 = &this->rawpacketlist;
  p_Stack_10050 = (_List_node_base *)&PTR_CreateCopy_0013bbb0;
  pRStack_10058 = this;
  do {
    lStack_100a0 = 0;
    ioctl(iStack_100a4,0x541b,&lStack_100a0);
    if (lStack_100a0 == 0) {
      tStack_10098.tv_sec._0_1_ = '\0';
      iVar4 = RTPSelect(&iStack_100a4,(int8_t *)&tStack_10098,1,(RTPTime)0x0);
      bVar11 = (char)tStack_10098.tv_sec != '\0';
      if (iVar4 < 0) {
        return iVar4;
      }
    }
    else {
      bVar11 = true;
    }
    if (bVar11) {
      if (RTPTime::CurrentTime()::s_initialized == '\0') {
        RTPTime::CurrentTime()::s_initialized = '\x01';
        clock_gettime(0,&tStack_10098);
        clock_gettime(1,&tStack_10048);
        p_Stack_10078 =
             (_List_node_base *)
             ((double)tStack_10098.tv_nsec * 1e-09 +
             (double)CONCAT71(tStack_10098.tv_sec._1_7_,(char)tStack_10098.tv_sec));
        RTPTime::CurrentTime()::s_startOffet =
             (double)p_Stack_10078 -
             ((double)tStack_10048.tv_nsec * 1e-09 + (double)tStack_10048.tv_sec);
      }
      else {
        clock_gettime(1,&tStack_10098);
        p_Stack_10078 =
             (_List_node_base *)
             ((double)tStack_10098.tv_nsec * 1e-09 +
              (double)CONCAT71(tStack_10098.tv_sec._1_7_,(char)tStack_10098.tv_sec) +
             RTPTime::CurrentTime()::s_startOffet);
      }
      sStack_1007c = 0x10;
      sVar5 = recvfrom(iStack_100a4,auStack_10038,0xffff,0,&sStack_10070,&sStack_1007c);
      if (((int)(uint)sVar5 < 1) ||
         ((this->receivemode != AcceptAll &&
          (bVar3 = ShouldAcceptData(this,(uint)sStack_10070.sa_data._2_4_ >> 0x18 |
                                         (sStack_10070.sa_data._2_4_ & 0xff0000) >> 8 |
                                         (sStack_10070.sa_data._2_4_ & 0xff00) << 8 |
                                         sStack_10070.sa_data._2_4_ << 0x18,
                                    sStack_10070.sa_data._0_2_ << 8 |
                                    (ushort)sStack_10070.sa_data._0_2_ >> 8), !bVar3)))) {
        bVar3 = true;
      }
      else {
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          p_Var6 = (_List_node_base *)operator_new(0x18);
        }
        else {
          p_Var6 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x18,0x17);
        }
        uVar8 = sStack_10070.sa_data._0_2_ << 8 | (ushort)sStack_10070.sa_data._0_2_ >> 8;
        *(undefined4 *)&p_Var6->_M_prev = 0;
        p_Var6->_M_next = p_Stack_10050;
        *(uint *)((long)&p_Var6->_M_prev + 4) =
             (uint)sStack_10070.sa_data._2_4_ >> 0x18 | (sStack_10070.sa_data._2_4_ & 0xff0000) >> 8
             | (sStack_10070.sa_data._2_4_ & 0xff00) << 8 | sStack_10070.sa_data._2_4_ << 0x18;
        *(ushort *)&p_Var6[1]._M_next = uVar8;
        *(ushort *)((long)&p_Var6[1]._M_next + 2) = uVar8 + 1;
        uVar10 = (uint)sVar5 & 0x7fffffff;
        __n = (_List_node_base *)(ulong)uVar10;
        pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
        if (pRVar2 == (RTPMemoryManager *)0x0) {
          __dest = (_List_node_base *)operator_new__((ulong)__n);
        }
        else {
          __dest = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,__n,iStack_10084)
          ;
        }
        bVar3 = __dest != (_List_node_base *)0x0;
        if (__dest == (_List_node_base *)0x0) {
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            (*(code *)p_Var6->_M_next[2]._M_next)(p_Var6);
          }
          else {
            (*(code *)p_Var6->_M_next[1]._M_prev)(p_Var6);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var6);
          }
          unaff_EBP = -1;
        }
        else {
          memcpy(__dest,auStack_10038,(size_t)__n);
          uVar9 = uStack_10080;
          if ((this->rtpsock == this->rtcpsock) && (uVar9 = 1, 4 < uVar10)) {
            uVar9 = (uint)((byte)(*(char *)((long)&__dest->_M_next + 1) + 0x33U) < 0xfb);
          }
          pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            p_Var7 = (_List_node_base *)operator_new(0x38);
          }
          else {
            p_Var7 = (_List_node_base *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,0x38,0x1b);
          }
          this = pRStack_10058;
          p_Var7->_M_prev =
               (_List_node_base *)(pRStack_10058->super_RTPTransmitter).super_RTPMemoryObject.mgr;
          p_Var7->_M_next = (_List_node_base *)&PTR__RTPRawPacket_0013bf20;
          p_Var7[2]._M_next = p_Stack_10078;
          p_Var7[1]._M_next = __dest;
          p_Var7[1]._M_prev = __n;
          p_Var7[2]._M_prev = p_Var6;
          *(char *)&p_Var7[3]._M_next = (char)uVar9;
          p_Var6 = (_List_node_base *)operator_new(0x18);
          p_Var6[1]._M_next = p_Var7;
          std::__detail::_List_node_base::_M_hook(p_Var6);
          psVar1 = &(this->rawpacketlist).
                    super__List_base<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 + 1;
        }
      }
      if (!bVar3) {
        return unaff_EBP;
      }
    }
    if (!bVar11) {
      return 0;
    }
  } while( true );
}

Assistant:

int RTPUDPv4Transmitter::PollSocket(bool rtp)
{
	RTPSOCKLENTYPE fromlen;
	int recvlen;
	char packetbuffer[RTPUDPV4TRANS_MAXPACKSIZE];
#ifdef RTP_SOCKETTYPE_WINSOCK
	SOCKET sock;
	unsigned long len;
#else 
	size_t len;
	int sock;
#endif // RTP_SOCKETTYPE_WINSOCK
	struct sockaddr_in srcaddr;
	bool dataavailable;
	
	if (rtp)
		sock = rtpsock;
	else
		sock = rtcpsock;
	
	do
	{
		len = 0;
		RTPIOCTL(sock,FIONREAD,&len);

		if (len <= 0) // make sure a packet of length zero is not queued
		{
			// An alternative workaround would be to just use non-blocking sockets.
			// However, since the user does have access to the sockets and I do not
			// know how this would affect anyone else's code, I chose to do it using
			// an extra select call in case ioctl says the length is zero.
			
			int8_t isset = 0;
			int status = RTPSelect(&sock, &isset, 1, RTPTime(0));
			if (status < 0)
				return status;

			if (isset)
				dataavailable = true;
			else
				dataavailable = false;
		}
		else
			dataavailable = true;
		
		if (dataavailable)
		{
			RTPTime curtime = RTPTime::CurrentTime();
			fromlen = sizeof(struct sockaddr_in);
			recvlen = recvfrom(sock,packetbuffer,RTPUDPV4TRANS_MAXPACKSIZE,0,(struct sockaddr *)&srcaddr,&fromlen);
			if (recvlen > 0)
			{
				bool acceptdata;

				// got data, process it
				if (receivemode == RTPTransmitter::AcceptAll)
					acceptdata = true;
				else
					acceptdata = ShouldAcceptData(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
				
				if (acceptdata)
				{
					RTPRawPacket *pack;
					RTPIPv4Address *addr;
					uint8_t *datacopy;

					addr = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPADDRESS) RTPIPv4Address(ntohl(srcaddr.sin_addr.s_addr),ntohs(srcaddr.sin_port));
					if (addr == 0)
						return ERR_RTP_OUTOFMEM;
					datacopy = RTPNew(GetMemoryManager(),(rtp)?RTPMEM_TYPE_BUFFER_RECEIVEDRTPPACKET:RTPMEM_TYPE_BUFFER_RECEIVEDRTCPPACKET) uint8_t[recvlen];
					if (datacopy == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(datacopy,packetbuffer,recvlen);
					
					bool isrtp = rtp;
					if (rtpsock == rtcpsock) // check payload type when multiplexing
					{
						isrtp = true;

						if ((size_t)recvlen > sizeof(RTCPCommonHeader))
						{
							RTCPCommonHeader *rtcpheader = (RTCPCommonHeader *)datacopy;
							uint8_t packettype = rtcpheader->packettype;

    						if (packettype >= 200 && packettype <= 204)
								isrtp = false;
						}
					}
						
					pack = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPRAWPACKET) RTPRawPacket(datacopy,recvlen,addr,curtime,isrtp,GetMemoryManager());
					if (pack == 0)
					{
						RTPDelete(addr,GetMemoryManager());
						RTPDeleteByteArray(datacopy,GetMemoryManager());
						return ERR_RTP_OUTOFMEM;
					}
					rawpacketlist.push_back(pack);	
				}
			}
		}
	} while (dataavailable);

	return 0;
}